

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  uint uVar2;
  uint _h;
  int iVar3;
  pointer pMVar4;
  Mat *this_00;
  size_t sVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 in_XMM2 [16];
  undefined1 auVar25 [16];
  void *local_248;
  long local_240;
  int *local_228;
  long local_220;
  long *local_218;
  long local_210;
  int local_1fc;
  long local_1f8;
  pointer local_1f0;
  pointer local_1d0;
  Mat local_1c8;
  long local_180;
  Mat local_178;
  Mat local_128;
  Mat local_d8;
  Mat *local_90;
  long local_88;
  pointer local_80;
  Mat local_78;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar4;
  local_1f0 = pMVar4;
  if (lVar6 != 0x48) {
    lVar9 = 0;
    if (this->attn_mask == 0) {
      lVar9 = 0x48;
    }
    if (lVar6 != 0x90) {
      lVar9 = 0x48;
    }
    local_1f0 = (pointer)((long)&pMVar4->data + lVar9);
  }
  local_1d0 = pMVar4;
  if ((lVar6 != 0x48) && (this->attn_mask == 0 || lVar6 != 0x90)) {
    local_1d0 = local_1f0;
    if (this->attn_mask == 0) {
      local_1d0 = pMVar4 + 2;
    }
    if (lVar6 != 0xd8) {
      local_1d0 = pMVar4 + 2;
    }
    if (lVar6 == 0x90) {
      local_1d0 = local_1f0;
    }
  }
  if (this->attn_mask == 0) {
    local_248 = (void *)0x0;
    local_228 = (int *)0x0;
    local_220 = 0;
    local_218 = (long *)0x0;
    local_1fc = 0;
    iVar1 = 0;
    local_1f8 = 0;
  }
  else {
    local_248 = *(void **)((long)pMVar4 + lVar6 + -0x48);
    local_228 = *(int **)((long)pMVar4 + lVar6 + -0x40);
    local_220 = *(long *)((long)pMVar4 + lVar6 + -0x38);
    local_218 = *(long **)((long)pMVar4 + lVar6 + -0x28);
    local_1fc = *(int *)((long)pMVar4 + lVar6 + -0x20);
    iVar1 = *(int *)((long)pMVar4 + lVar6 + -0x1c);
    local_1f8 = *(long *)((long)pMVar4 + lVar6 + -8);
    if (local_228 != (int *)0x0) {
      LOCK();
      *local_228 = *local_228 + 1;
      UNLOCK();
    }
  }
  uVar2 = pMVar4->h;
  uVar16 = (ulong)uVar2;
  _h = local_1f0->h;
  uVar20 = (ulong)_h;
  uVar14 = (long)this->embed_dim / (long)this->num_heads;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,uVar2,4,opt->blob_allocator);
  iVar18 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.allocator = (Allocator *)0x0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    iVar18 = (int)uVar14;
    local_90 = this_00;
    Mat::create(&local_d8,iVar18,uVar2,this->num_heads,4,opt->workspace_allocator);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    Mat::create(&local_128,iVar18,_h,this->num_heads,4,opt->workspace_allocator);
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.allocator = (Allocator *)0x0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    Mat::create(&local_178,_h,iVar18,this->num_heads,4,opt->workspace_allocator);
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.allocator = (Allocator *)0x0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    Mat::create(&local_1c8,_h,uVar2,this->num_heads,4,opt->workspace_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    local_80 = pMVar4;
    Mat::create(&local_78,iVar18,this->num_heads,uVar2,4,opt->workspace_allocator);
    if (0 < this->num_heads) {
      auVar25 = rsqrtss(in_XMM2,ZEXT416((uint)(float)iVar18));
      fVar23 = auVar25._0_4_;
      lVar6 = (long)iVar18;
      uVar14 = uVar14 & 0xffffffff;
      local_88 = lVar6 * 4;
      local_180 = iVar1 * local_220;
      local_210 = 0;
      local_240 = 0;
      do {
        if (0 < (int)uVar2) {
          iVar1 = this->embed_dim;
          pvVar10 = (this->q_bias_data).data;
          pvVar11 = (this->q_weight_data).data;
          uVar12 = 0;
          do {
            if (0 < iVar18) {
              iVar3 = local_80->w;
              sVar5 = local_80->elemsize;
              pvVar13 = local_80->data;
              uVar17 = 0;
              pvVar15 = (void *)(local_210 * iVar1 + (long)pvVar11);
              do {
                fVar21 = *(float *)((long)pvVar10 + (local_240 * lVar6 + uVar17) * 4);
                if (0 < iVar1) {
                  lVar9 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)pvVar15 + lVar9 * 4) *
                                      *(float *)((long)pvVar13 +
                                                lVar9 * 4 + sVar5 * uVar12 * (long)iVar3);
                    lVar9 = lVar9 + 1;
                  } while (iVar1 != (int)lVar9);
                }
                *(float *)((long)local_d8.data +
                          uVar17 * 4 +
                          (long)local_d8.w *
                          CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar12 +
                          local_d8.cstep * local_240 *
                          CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)) =
                     fVar21 * fVar23 * -0.5 * ((float)iVar18 * fVar23 * fVar23 + -3.0);
                uVar17 = uVar17 + 1;
                pvVar15 = (void *)((long)pvVar15 + (long)iVar1 * 4);
              } while (uVar17 != uVar14);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar16);
        }
        if (0 < (int)_h) {
          iVar1 = this->kdim;
          pvVar10 = (this->k_bias_data).data;
          pvVar11 = (this->k_weight_data).data;
          uVar12 = 0;
          do {
            if (0 < iVar18) {
              iVar3 = local_1f0->w;
              sVar5 = local_1f0->elemsize;
              pvVar13 = local_1f0->data;
              uVar17 = 0;
              pvVar15 = (void *)(local_210 * iVar1 + (long)pvVar11);
              do {
                fVar21 = *(float *)((long)pvVar10 + (local_240 * lVar6 + uVar17) * 4);
                if (0 < iVar1) {
                  lVar9 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)pvVar15 + lVar9 * 4) *
                                      *(float *)((long)pvVar13 +
                                                lVar9 * 4 + sVar5 * uVar12 * (long)iVar3);
                    lVar9 = lVar9 + 1;
                  } while (iVar1 != (int)lVar9);
                }
                *(float *)((long)local_128.data +
                          uVar17 * 4 +
                          (long)local_128.w *
                          CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) * uVar12
                          + local_128.cstep * local_240 *
                            CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize)) =
                     fVar21;
                uVar17 = uVar17 + 1;
                pvVar15 = (void *)((long)pvVar15 + (long)iVar1 * 4);
              } while (uVar17 != uVar14);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar20);
        }
        if (0 < iVar18) {
          iVar1 = this->vdim;
          pvVar10 = (this->v_bias_data).data;
          pvVar11 = (void *)(local_210 * iVar1 + (long)(this->v_weight_data).data);
          uVar12 = 0;
          do {
            if (0 < (int)_h) {
              pvVar13 = local_1d0->data;
              iVar3 = local_1d0->w;
              sVar5 = local_1d0->elemsize;
              uVar17 = 0;
              do {
                fVar21 = *(float *)((long)pvVar10 + (uVar12 + local_240 * lVar6) * 4);
                if (0 < iVar1) {
                  lVar9 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)pvVar11 + lVar9 * 4) *
                                      *(float *)((long)pvVar13 + lVar9 * 4);
                    lVar9 = lVar9 + 1;
                  } while (iVar1 != (int)lVar9);
                }
                *(float *)((long)local_178.data +
                          uVar17 * 4 +
                          (long)local_178.w *
                          CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) * uVar12
                          + local_178.cstep * local_240 *
                            CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize)) =
                     fVar21;
                uVar17 = uVar17 + 1;
                pvVar13 = (void *)((long)pvVar13 + (long)iVar3 * sVar5);
              } while (uVar17 != uVar20);
            }
            uVar12 = uVar12 + 1;
            pvVar11 = (void *)((long)pvVar11 + (long)iVar1 * 4);
          } while (uVar12 != uVar14);
        }
        if (0 < (int)uVar2) {
          pvVar10 = (void *)(local_d8.cstep *
                             CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) *
                             local_240 + (long)local_d8.data);
          uVar12 = 0;
          do {
            if (0 < (int)_h) {
              uVar17 = 0;
              pvVar11 = (void *)(CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) *
                                 local_128.cstep * local_240 + (long)local_128.data);
              do {
                fVar21 = 0.0;
                if (0 < iVar18) {
                  lVar9 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)pvVar11 + lVar9 * 4) *
                                      *(float *)((long)pvVar10 + lVar9 * 4);
                    lVar9 = lVar9 + 1;
                  } while (iVar18 != (int)lVar9);
                }
                *(float *)((long)local_1c8.data +
                          uVar17 * 4 +
                          (long)local_1c8.w *
                          CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) * uVar12
                          + local_1c8.cstep * local_240 *
                            CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize)) =
                     fVar21;
                uVar17 = uVar17 + 1;
                pvVar11 = (void *)((long)pvVar11 +
                                  (long)local_128.w *
                                  CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize))
                ;
              } while (uVar17 != uVar20);
            }
            uVar12 = uVar12 + 1;
            pvVar10 = (void *)((long)pvVar10 +
                              (long)local_d8.w *
                              CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize));
          } while (uVar12 != uVar16);
        }
        if (this->attn_mask != 0) {
          if (local_1fc == 3) {
            piVar7 = (int *)0x0;
            pvVar10 = (void *)(local_1f8 * local_220 * local_240 + (long)local_248);
          }
          else {
            piVar7 = local_228;
            pvVar10 = local_248;
            if (local_228 != (int *)0x0) {
              LOCK();
              *local_228 = *local_228 + 1;
              UNLOCK();
            }
          }
          if (0 < (int)uVar2) {
            pvVar13 = (void *)(CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                               local_1c8.cstep * local_240 + (long)local_1c8.data);
            uVar12 = 0;
            pvVar11 = pvVar10;
            do {
              if (0 < (int)_h) {
                uVar17 = 0;
                do {
                  *(float *)((long)pvVar13 + uVar17 * 4) =
                       *(float *)((long)pvVar13 + uVar17 * 4) +
                       *(float *)((long)pvVar11 + uVar17 * 4);
                  uVar17 = uVar17 + 1;
                } while (uVar20 != uVar17);
              }
              uVar12 = uVar12 + 1;
              pvVar13 = (void *)((long)pvVar13 +
                                (long)local_1c8.w *
                                CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
              pvVar11 = (void *)((long)pvVar11 + local_180);
            } while (uVar12 != uVar16);
          }
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (local_218 == (long *)0x0) {
                if (pvVar10 != (void *)0x0) {
                  free(pvVar10);
                }
              }
              else {
                (**(code **)(*local_218 + 0x18))();
              }
            }
          }
        }
        if (0 < (int)uVar2) {
          lVar9 = CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize);
          lVar8 = (long)local_1c8.w;
          pvVar10 = (void *)(lVar9 * local_1c8.cstep * local_240 + (long)local_1c8.data);
          uVar12 = 0;
          do {
            fVar21 = -3.4028235e+38;
            if (0 < (int)_h) {
              uVar17 = 0;
              fVar21 = -3.4028235e+38;
              do {
                fVar24 = *(float *)((long)pvVar10 + uVar17 * 4);
                if (fVar21 <= fVar24) {
                  fVar21 = fVar24;
                }
                uVar17 = uVar17 + 1;
              } while (uVar20 != uVar17);
            }
            fVar24 = 0.0;
            if (0 < (int)_h) {
              uVar17 = 0;
              do {
                fVar22 = expf(*(float *)((long)pvVar10 + uVar17 * 4) - fVar21);
                *(float *)((long)pvVar10 + uVar17 * 4) = fVar22;
                fVar24 = fVar24 + fVar22;
                uVar17 = uVar17 + 1;
              } while (uVar20 != uVar17);
            }
            if (0 < (int)_h) {
              uVar17 = 0;
              do {
                *(float *)((long)pvVar10 + uVar17 * 4) =
                     *(float *)((long)pvVar10 + uVar17 * 4) * (1.0 / fVar24);
                uVar17 = uVar17 + 1;
              } while (uVar20 != uVar17);
            }
            uVar12 = uVar12 + 1;
            pvVar10 = (void *)((long)pvVar10 + lVar8 * lVar9);
          } while (uVar12 != uVar16);
        }
        if (0 < (int)uVar2) {
          pvVar10 = (void *)(local_1c8.cstep *
                             CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize) *
                             local_240 + (long)local_1c8.data);
          uVar12 = 0;
          do {
            if (0 < iVar18) {
              uVar17 = 0;
              pvVar11 = (void *)(CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) *
                                 local_178.cstep * local_240 + (long)local_178.data);
              do {
                fVar21 = 0.0;
                if (0 < (int)_h) {
                  lVar9 = 0;
                  do {
                    fVar21 = fVar21 + *(float *)((long)pvVar11 + lVar9 * 4) *
                                      *(float *)((long)pvVar10 + lVar9 * 4);
                    lVar9 = lVar9 + 1;
                  } while (_h != (uint)lVar9);
                }
                *(float *)((long)local_78.data +
                          uVar17 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * uVar12 +
                          local_78.w * local_240 *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize)) = fVar21;
                uVar17 = uVar17 + 1;
                pvVar11 = (void *)((long)pvVar11 +
                                  (long)local_178.w *
                                  CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize))
                ;
              } while (uVar17 != uVar14);
            }
            uVar12 = uVar12 + 1;
            pvVar10 = (void *)((long)pvVar10 +
                              (long)local_1c8.w *
                              CONCAT44(local_1c8.elemsize._4_4_,(undefined4)local_1c8.elemsize));
          } while (uVar12 != uVar16);
        }
        local_240 = local_240 + 1;
        local_210 = local_210 + local_88;
      } while (local_240 < this->num_heads);
    }
    if (0 < (int)uVar2) {
      pvVar10 = local_90->data;
      iVar1 = local_90->w;
      sVar5 = local_90->elemsize;
      uVar2 = this->embed_dim;
      pvVar11 = (this->out_weight_data).data;
      pvVar13 = (this->out_bias_data).data;
      uVar14 = 0;
      pvVar15 = local_78.data;
      do {
        if (0 < (int)uVar2) {
          uVar20 = 0;
          pvVar19 = pvVar11;
          do {
            fVar23 = *(float *)((long)pvVar13 + uVar20 * 4);
            if (0 < (int)uVar2) {
              lVar6 = 0;
              do {
                fVar23 = fVar23 + *(float *)((long)pvVar19 + lVar6 * 4) *
                                  *(float *)((long)pvVar15 + lVar6 * 4);
                lVar6 = lVar6 + 1;
              } while (uVar2 != (uint)lVar6);
            }
            *(float *)((long)pvVar10 + uVar20 * 4 + (long)iVar1 * sVar5 * uVar14) = fVar23;
            uVar20 = uVar20 + 1;
            pvVar19 = (void *)((long)pvVar19 + (long)(int)uVar2 * 4);
          } while (uVar20 != uVar2);
        }
        uVar14 = uVar14 + 1;
        pvVar15 = (void *)((long)pvVar15 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
      } while (uVar14 != uVar16);
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    piVar7 = (int *)CONCAT44(local_1c8.refcount._4_4_,local_1c8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_1c8.allocator == (Allocator *)0x0) {
          if (local_1c8.data != (void *)0x0) {
            free(local_1c8.data);
          }
        }
        else {
          (*(local_1c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_1c8.cstep = 0;
    local_1c8.data = (void *)0x0;
    local_1c8.refcount._0_4_ = 0;
    local_1c8.refcount._4_4_ = 0;
    local_1c8.elemsize._0_4_ = 0;
    local_1c8.elemsize._4_4_ = 0;
    local_1c8.elempack = 0;
    local_1c8.dims = 0;
    local_1c8.w = 0;
    local_1c8.h = 0;
    local_1c8.d = 0;
    local_1c8.c = 0;
    piVar7 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_178.cstep = 0;
    local_178.data = (void *)0x0;
    local_178.refcount._0_4_ = 0;
    local_178.refcount._4_4_ = 0;
    local_178.elemsize._0_4_ = 0;
    local_178.elemsize._4_4_ = 0;
    local_178.elempack = 0;
    local_178.dims = 0;
    local_178.w = 0;
    local_178.h = 0;
    local_178.d = 0;
    local_178.c = 0;
    piVar7 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    piVar7 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_d8.cstep = 0;
    local_d8.data = (void *)0x0;
    local_d8.refcount._0_4_ = 0;
    local_d8.refcount._4_4_ = 0;
    local_d8.elemsize._0_4_ = 0;
    local_d8.elemsize._4_4_ = 0;
    local_d8.elempack = 0;
    local_d8.dims = 0;
    local_d8.w = 0;
    local_d8.h = 0;
    local_d8.d = 0;
    local_d8.c = 0;
    iVar18 = 0;
  }
  if (local_228 != (int *)0x0) {
    LOCK();
    *local_228 = *local_228 + -1;
    UNLOCK();
    if (*local_228 == 0) {
      if (local_218 == (long *)0x0) {
        if (local_248 != (void *)0x0) {
          free(local_248);
        }
      }
      else {
        (**(code **)(*local_218 + 0x18))(local_218,local_248);
      }
    }
  }
  return iVar18;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    const int src_seqlen = q_blob.h;
    const int dst_seqlen = k_blob.h;
    const int embed_dim_per_head = embed_dim / num_heads;

    // assert k_blob.h == v_blob.h

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, src_seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, src_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, dst_seqlen, num_heads, 4u, opt.workspace_allocator);
    Mat xv(dst_seqlen, embed_dim_per_head, num_heads, 4u, opt.workspace_allocator);

    Mat xqk(dst_seqlen, src_seqlen, num_heads, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_heads, src_seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrtf(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_heads; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < dst_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + kdim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < kdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + vdim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < vdim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, src_seqlen)
        // xk  (embed_dim_per_head, dst_seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xqk + mask
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob.dims == 3 ? attn_mask_blob.channel(q) : attn_mask_blob;
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                const float* mptr = maskm.row(i);
                float* outptr = outm.row(i);

                for (int j = 0; j < dst_seqlen; j++)
                {
                    outptr[j] += mptr[j];
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] = (float)(expf(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < dst_seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (dst_seqlen, src_seqlen)
        // xv  (dst_seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_heads, src_seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < src_seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < dst_seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, src_seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < src_seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}